

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O2

t_int * vinlet_doprolog(t_int *w)

{
  int iVar1;
  long lVar2;
  long lVar3;
  t_int tVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  int iVar8;
  
  lVar2 = w[1];
  lVar3 = w[2];
  tVar4 = w[3];
  puVar5 = *(undefined4 **)(lVar2 + 0x58);
  if (puVar5 == *(undefined4 **)(lVar2 + 0x50)) {
    puVar6 = *(undefined4 **)(lVar2 + 0x48);
    iVar1 = *(int *)(lVar2 + 0x68);
    for (iVar8 = iVar1 - *(int *)(lVar2 + 0x40); iVar8 != 0; iVar8 = iVar8 + 1) {
      *puVar6 = puVar6[iVar1];
      puVar6 = puVar6 + 1;
    }
    puVar5 = puVar5 + -(long)iVar1;
  }
  for (lVar7 = 0; (int)tVar4 != (int)lVar7; lVar7 = lVar7 + 1) {
    *puVar5 = *(undefined4 *)(lVar3 + lVar7 * 4);
    puVar5 = puVar5 + 1;
  }
  *(undefined4 **)(lVar2 + 0x58) = puVar5;
  return w + 4;
}

Assistant:

t_int *vinlet_doprolog(t_int *w)
{
    t_vinlet *x = (t_vinlet *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *out = x->x_fill;
    if (out == x->x_endbuf)
    {
        t_sample *f1 = x->x_buf, *f2 = x->x_buf + x->x_hop;
        int nshift = x->x_bufsize - x->x_hop;
        out -= x->x_hop;
        while (nshift--) *f1++ = *f2++;
    }

    while (n--) *out++ = *in++;
    x->x_fill = out;
    return (w+4);
}